

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_menubar_begin(nk_context *ctx)

{
  float *pfVar1;
  float fVar2;
  nk_panel *pnVar3;
  nk_uint *pnVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x42f1,"void nk_menubar_begin(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x42f2,"void nk_menubar_begin(struct nk_context *)");
  }
  pnVar3 = ctx->current->layout;
  if (pnVar3 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x42f3,"void nk_menubar_begin(struct nk_context *)");
  }
  fVar2 = pnVar3->at_y;
  pfVar1 = &(pnVar3->bounds).y;
  if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
    if ((pnVar3->flags & 0xa000) == 0) {
      (pnVar3->menu).x = pnVar3->at_x;
      (pnVar3->menu).y = fVar2 + (pnVar3->row).height;
      (pnVar3->menu).w = (pnVar3->bounds).w;
      (pnVar3->menu).offset.x = *pnVar3->offset_x;
      pnVar4 = pnVar3->offset_y;
      (pnVar3->menu).offset.y = *pnVar4;
      *pnVar4 = 0;
    }
    return;
  }
  __assert_fail("layout->at_y == layout->bounds.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x42f8,"void nk_menubar_begin(struct nk_context *)");
}

Assistant:

NK_API void
nk_menubar_begin(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    layout = ctx->current->layout;
    NK_ASSERT(layout->at_y == layout->bounds.y);
    /* if this assert triggers you allocated space between nk_begin and nk_menubar_begin.
    If you want a menubar the first nuklear function after `nk_begin` has to be a
    `nk_menubar_begin` call. Inside the menubar you then have to allocate space for
    widgets (also supports multiple rows).
    Example:
        if (nk_begin(...)) {
            nk_menubar_begin(...);
                nk_layout_xxxx(...);
                nk_button(...);
                nk_layout_xxxx(...);
                nk_button(...);
            nk_menubar_end(...);
        }
        nk_end(...);
    */
    if (layout->flags & NK_WINDOW_HIDDEN || layout->flags & NK_WINDOW_MINIMIZED)
        return;

    layout->menu.x = layout->at_x;
    layout->menu.y = layout->at_y + layout->row.height;
    layout->menu.w = layout->bounds.w;
    layout->menu.offset.x = *layout->offset_x;
    layout->menu.offset.y = *layout->offset_y;
    *layout->offset_y = 0;
}